

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O3

void __thiscall Matrix<double>::Matrix(Matrix<double> *this,int a,int b)

{
  double **ppdVar1;
  double *pdVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  this->n = a;
  this->m = b;
  uVar5 = (ulong)(uint)a;
  uVar4 = uVar5 * 8;
  if (a < 0) {
    uVar4 = 0xffffffffffffffff;
  }
  ppdVar1 = (double **)operator_new__(uVar4);
  this->M = ppdVar1;
  if (0 < a) {
    uVar4 = (ulong)(uint)b * 8;
    if (b < 0) {
      uVar4 = 0xffffffffffffffff;
    }
    uVar3 = 0;
    do {
      pdVar2 = (double *)operator_new__(uVar4);
      this->M[uVar3] = pdVar2;
      uVar3 = uVar3 + 1;
    } while (uVar5 != uVar3);
    if (0 < a) {
      ppdVar1 = this->M;
      uVar4 = 0;
      do {
        if (0 < b) {
          memset(ppdVar1[uVar4],0,(ulong)(uint)b << 3);
        }
        uVar4 = uVar4 + 1;
      } while (uVar5 != uVar4);
    }
  }
  return;
}

Assistant:

Matrix(int a, int b) {
    n = a;
    m = b;
    M = new T*[n];
    for (int i = 0; i < n; i++) {
      M[i] = new T[m];
    }
    for (int i = 0; i < n; i++) {
      for (int j = 0; j < m; j++) {
        M[i][j] = 0;
      }
    }
  }